

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  string local_60;
  string local_40;
  
  Option<Catch::GroupInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentGroupInfo.
              super_Option<Catch::GroupInfo>,groupInfo);
  (this->super_StreamingReporterBase<Catch::XmlReporter>).currentGroupInfo.used = false;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Group","");
  XmlWriter::startElement(&this->m_xml,&local_40,Newline|Indent);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"name","");
  XmlWriter::writeAttribute(&this->m_xml,&local_60,&groupInfo->name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void XmlReporter::testGroupStarting( GroupInfo const& groupInfo ) {
        StreamingReporterBase::testGroupStarting( groupInfo );
        m_xml.startElement( "Group" )
            .writeAttribute( "name", groupInfo.name );
    }